

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpreadsheetMode.cpp
# Opt level: O2

void __thiscall KDReports::Test::testHorizontalScaling(Test *this)

{
  char cVar1;
  int iVar2;
  AutoTableElement *pAVar3;
  reference pQVar4;
  int iVar5;
  double dVar6;
  QLatin1String latin1;
  QArrayDataPointer<QRect> QStack_88;
  QArrayDataPointer<QRect> local_68;
  Report report;
  QRect local_38;
  QRect local_28;
  
  fillModel(this,0x14,4,false);
  KDReports::Report::Report(&report,(QObject *)0x0);
  KDReports::Report::setReportMode((ReportMode)&report);
  pAVar3 = (AutoTableElement *)KDReports::Report::mainTable();
  KDReports::AutoTableElement::AutoTableElement
            ((AutoTableElement *)&QStack_88,(QAbstractItemModel *)&this->m_model);
  KDReports::MainTable::setAutoTableElement(pAVar3);
  KDReports::AutoTableElement::~AutoTableElement((AutoTableElement *)&QStack_88);
  KDReports::Report::scaleTo((int)&report,2);
  latin1.m_data = "Noto Sans";
  latin1.m_size = 9;
  QString::QString((QString *)&QStack_88,latin1);
  QFont::QFont((QFont *)&local_68,(QString *)&QStack_88,0x30,-1,false);
  KDReports::Report::setDefaultFont((QFont *)&report);
  QFont::~QFont((QFont *)&local_68);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&QStack_88);
  iVar2 = KDReports::Report::numberOfPages();
  cVar1 = QTest::qCompare(iVar2,2,"report.numberOfPages()","2",
                          "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                          ,0xf1);
  if (cVar1 != '\0') {
    KDReports::Report::mainTable();
    dVar6 = (double)KDReports::MainTable::lastAutoFontScalingFactor();
    cVar1 = QTest::qVerify(dVar6 < 0.9,"report.mainTable()->lastAutoFontScalingFactor() < 0.9","",
                           "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                           ,0xf2);
    if (cVar1 != '\0') {
      KDReports::Report::mainTable();
      KDReports::MainTable::pageRects();
      pQVar4 = QList<QRect>::operator[]((QList<QRect> *)&QStack_88,0);
      iVar5 = pQVar4->x2 - pQVar4->x1;
      iVar2 = iVar5 + 1;
      QArrayDataPointer<QRect>::~QArrayDataPointer(&QStack_88);
      if (iVar5 - 9U < 6) {
        QString::number((int)&local_68,iVar2);
        QString::toLocal8Bit((QByteArray *)&QStack_88,(QString *)&local_68);
        if (QStack_88.ptr == (QRect *)0x0) {
          QStack_88.ptr = (QRect *)&QByteArray::_empty;
        }
        cVar1 = QTest::qVerify(true,"columns >= 10 && columns <= 15",(char *)QStack_88.ptr,
                               "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                               ,0xf5);
      }
      else {
        QString::number((int)&local_68,iVar2);
        QString::toLocal8Bit((QByteArray *)&QStack_88,(QString *)&local_68);
        if (QStack_88.ptr == (QRect *)0x0) {
          QStack_88.ptr = (QRect *)&QByteArray::_empty;
        }
        cVar1 = QTest::qVerify(false,"columns >= 10 && columns <= 15",(char *)QStack_88.ptr,
                               "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                               ,0xf5);
      }
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&QStack_88);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
      if (cVar1 != '\0') {
        KDReports::Report::mainTable();
        KDReports::MainTable::pageRects();
        local_68.size = 0;
        local_28.x1 = 0;
        local_28.y1 = 0;
        local_68.d = (Data *)0x0;
        local_68.ptr = (QRect *)0x0;
        local_28.y2 = 3;
        local_28.x2 = iVar5;
        QList<QRect>::emplaceBack<QRect>((QList<QRect> *)&local_68,&local_28);
        local_38.y1 = 0;
        local_38.x2 = 0x13;
        local_38.y2 = 3;
        local_38.x1 = iVar2;
        QList<QRect>::emplaceBack<QRect>((QList<QRect> *)&local_68,&local_38);
        QTest::qCompare<QRect>
                  ((QList<QRect> *)&QStack_88,(QList<QRect> *)&local_68,
                   "report.mainTable()->pageRects()",
                   "QList<QRect>() << QRect(0, 0, columns, 4) << QRect(columns, 0, totalColumns - columns, 4)"
                   ,
                   "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                   ,0xf6);
        QArrayDataPointer<QRect>::~QArrayDataPointer(&local_68);
        QArrayDataPointer<QRect>::~QArrayDataPointer(&QStack_88);
      }
    }
  }
  KDReports::Report::~Report(&report);
  return;
}

Assistant:

void testHorizontalScaling()
    {
        const int totalColumns = 20;
        fillModel(totalColumns, 4);
        Report report;
        report.setReportMode(Report::SpreadSheet);
        report.mainTable()->setAutoTableElement(AutoTableElement(&m_model));
        report.scaleTo(2, 1); // must fit in two pages horizontally
        report.setDefaultFont(QFont(QLatin1String(s_fontName), 48));
        QCOMPARE(report.numberOfPages(), 2);
        QVERIFY(report.mainTable()->lastAutoFontScalingFactor() < 0.9);
        // qDebug() << report.mainTable()->pageRects();
        const int columns = report.mainTable()->pageRects()[0].width();
        QVERIFY2(columns >= 10 && columns <= 15, qPrintable(QString::number(columns)));
        QCOMPARE(report.mainTable()->pageRects(), QList<QRect>() << QRect(0, 0, columns, 4) << QRect(columns, 0, totalColumns - columns, 4));
    }